

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloorPlanGraph.hpp
# Opt level: O1

void __thiscall
graphProperties::serialize<boost::archive::binary_oarchive>
          (graphProperties *this,binary_oarchive *ar,uint version)

{
  basic_binary_oprimitive<boost::archive::binary_oarchive,_char,_std::char_traits<char>_> *this_00;
  
  boost::archive::detail::basic_oarchive::end_preamble();
  this_00 = &(ar->
             super_binary_oarchive_impl<boost::archive::binary_oarchive,_char,_std::char_traits<char>_>
             ).
             super_basic_binary_oprimitive<boost::archive::binary_oarchive,_char,_std::char_traits<char>_>
  ;
  boost::archive::
  basic_binary_oprimitive<boost::archive::binary_oarchive,char,std::char_traits<char>>::save
            ((string *)this_00);
  boost::archive::detail::basic_oarchive::end_preamble();
  boost::archive::
  basic_binary_oprimitive<boost::archive::binary_oarchive,char,std::char_traits<char>>::save
            ((string *)this_00);
  boost::archive::detail::basic_oarchive::end_preamble();
  boost::archive::
  basic_binary_oprimitive<boost::archive::binary_oarchive,_char,_std::char_traits<char>_>::
  save<double>(this_00,&this->maxx);
  boost::archive::detail::basic_oarchive::end_preamble();
  boost::archive::
  basic_binary_oprimitive<boost::archive::binary_oarchive,_char,_std::char_traits<char>_>::
  save<double>(this_00,&this->maxy);
  boost::archive::detail::basic_oarchive::end_preamble();
  boost::archive::
  basic_binary_oprimitive<boost::archive::binary_oarchive,_char,_std::char_traits<char>_>::
  save<double>(this_00,&this->minx);
  boost::archive::detail::basic_oarchive::end_preamble();
  boost::archive::
  basic_binary_oprimitive<boost::archive::binary_oarchive,_char,_std::char_traits<char>_>::
  save<double>(this_00,&this->minx);
  boost::serialization::
  singleton<boost::archive::detail::oserializer<boost::archive::binary_oarchive,_Point2D>_>::
  get_instance();
  boost::archive::detail::basic_oarchive::save_object(ar,(basic_oserializer *)&this->centroid);
  return;
}

Assistant:

void serialize(Archive &ar, const unsigned int version)
        {

            ar & floorname;
            ar & filepath;
            ar & maxx;
            ar & maxy;
            ar & minx;
            ar & minx;
            ar & centroid;
        }